

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_nonfinite<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,bool isinf,
          basic_format_specs<char> *specs,float_specs *fspecs)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  char *__first;
  ulong uVar9;
  bool bVar10;
  
  uVar4 = (ulong)specs->width;
  if (-1 < (long)uVar4) {
    uVar2 = *(uint *)&fspecs->field_0x4;
    uVar8 = uVar2 >> 8 & 0xff;
    uVar6 = (ulong)(uVar8 != 0) + 3;
    uVar9 = 0;
    if (uVar6 <= uVar4) {
      uVar9 = uVar4 - uVar6;
    }
    uVar4 = uVar9 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    bVar5 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (out,uVar4,&specs->fill);
    if (uVar8 != 0) {
      cVar1 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar8);
      if ((bVar5.container)->capacity_ < (bVar5.container)->size_ + 1) {
        (**(bVar5.container)->_vptr_buffer)(bVar5.container);
      }
      sVar3 = (bVar5.container)->size_;
      (bVar5.container)->size_ = sVar3 + 1;
      (bVar5.container)->ptr_[sVar3] = cVar1;
    }
    bVar10 = (uVar2 >> 0x10 & 1) == 0;
    pcVar7 = "INF";
    if (bVar10) {
      pcVar7 = "inf";
    }
    __first = "NAN";
    if (bVar10) {
      __first = "nan";
    }
    if (isinf) {
      __first = pcVar7;
    }
    bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                      (__first,__first + 3,bVar5);
    bVar5 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                      (bVar5,uVar9 - uVar4,&specs->fill);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}